

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::usda::USDAReader::Impl::ReconstructPrim<tinyusdz::Xform>
          (Impl *this,Specifier *spec,PropertyMap *properties,ReferenceList *references,Xform *xform
          )

{
  bool bVar1;
  ostream *poVar2;
  string err;
  ostringstream ss_e;
  string local_1d8;
  long *local_1b8;
  long local_1a8 [2];
  PrimReconstructOptions local_198 [112];
  ios_base local_128 [264];
  
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_198[0].strict_allowedToken_check = false;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Xform>
                    (spec,properties,references,xform,&this->_warn,&local_1d8,local_198);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReconstructPrim",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_198,0x61e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Failed to reconstruct Xform Prim: ",0x22);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1b8);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    ::std::ios_base::~ios_base(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool USDAReader::Impl::ReconstructPrim(
    const Specifier &spec,
    const prim::PropertyMap &properties,
    const prim::ReferenceList &references,
    Xform *xform) {

  std::string err;
  if (!prim::ReconstructPrim(spec, properties, references, xform, &_warn, &err)) {
    PUSH_ERROR_AND_RETURN("Failed to reconstruct Xform Prim: " << err);
  }
  return true;
}